

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::dumpMemoryToFile(CLIntercept *this,string *fileName,bool hash,void *ptr,size_t size)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  uint64_t uVar3;
  void *this_00;
  ostream *poVar4;
  long in_RCX;
  byte in_DL;
  CLIntercept *in_RDI;
  float __x;
  uint64_t hashValue;
  ofstream os;
  size_t in_stack_fffffffffffffd90;
  void *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  char local_228 [520];
  long local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = in_RCX;
  std::ofstream::ofstream(local_228);
  _Var2 = std::__cxx11::string::c_str();
  std::operator|(_S_out,_S_bin);
  std::ofstream::open(local_228,_Var2);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    __x = (float)std::__cxx11::string::c_str();
    logf(in_RDI,__x);
  }
  else {
    if ((local_11 & 1) == 0) {
      std::ostream::write(local_228,local_20);
    }
    else {
      uVar3 = computeHash((CLIntercept *)CONCAT17(bVar1,in_stack_fffffffffffffda0),
                          in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      this_00 = (void *)std::ostream::operator<<(local_228,std::hex);
      poVar4 = (ostream *)std::ostream::operator<<(this_00,uVar3);
      std::operator<<(poVar4,"\n");
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_228);
  return;
}

Assistant:

void CLIntercept::dumpMemoryToFile(
    const std::string& fileName,
    bool hash,
    const void* ptr,
    size_t size  )
{
    std::ofstream os;
    os.open(
        fileName.c_str(),
        std::ios::out | std::ios::binary );

    if( os.good() )
    {
        if( hash )
        {
            uint64_t hashValue = computeHash(ptr, size);
            os << std::hex << hashValue << "\n";
        }
        else
        {
            os.write( (const char*)ptr, size );
        }

        os.close();
    }
    else
    {
        logf( "Failed to open dump file for writing: %s\n",
            fileName.c_str() );
    }
}